

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetActiveIdUsingNavAndKeys(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  (GImGui->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[2] = 0xffffffff;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[3] = 0xffffffff;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[4] = 0xffffffff;
  pIVar1->ActiveIdUsingNavDirMask = 0xffffffff;
  pIVar1->ActiveIdUsingNavInputMask = 0xffffffff;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[0] = 0xffffffff;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
  pIVar1->NavMoveSubmitted = false;
  pIVar1->NavMoveScoringItems = false;
  pIVar1->NavAnyRequest = pIVar1->NavInitRequest;
  return;
}

Assistant:

void ImGui::SetActiveIdUsingNavAndKeys()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId != 0);
    g.ActiveIdUsingNavDirMask = ~(ImU32)0;
    g.ActiveIdUsingNavInputMask = ~(ImU32)0;
    g.ActiveIdUsingKeyInputMask.SetAllBits();
    NavMoveRequestCancel();
}